

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-encoder.c
# Opt level: O0

int mg_session_send_pull_message(mg_session *session,mg_map *extra)

{
  int iVar1;
  mg_session *in_RSI;
  long in_RDI;
  int status_2;
  int status_1;
  int status;
  uint8_t marker;
  undefined4 in_stack_ffffffffffffffdc;
  uint8_t val;
  undefined4 in_stack_ffffffffffffffe0;
  undefined3 in_stack_ffffffffffffffe4;
  uint uVar2;
  int local_4;
  
  uVar2 = CONCAT13((*(int *)(in_RDI + 0x18) == 4) + -0x50,in_stack_ffffffffffffffe4);
  val = (uint8_t)((uint)in_stack_ffffffffffffffdc >> 0x18);
  iVar1 = mg_session_write_uint8((mg_session *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),val);
  local_4 = iVar1;
  if (((iVar1 == 0) &&
      (local_4 = mg_session_write_uint8((mg_session *)((ulong)uVar2 << 0x20),val), local_4 == 0)) &&
     ((*(int *)(in_RDI + 0x18) != 4 ||
      (local_4 = mg_session_write_map(in_RSI,(mg_map *)CONCAT44(uVar2,iVar1)), local_4 == 0)))) {
    local_4 = mg_session_flush_message(in_RSI);
  }
  return local_4;
}

Assistant:

int mg_session_send_pull_message(mg_session *session, const mg_map *extra) {
  uint8_t marker = MG_MARKER_TINY_STRUCT + (session->version == 4);
  MG_RETURN_IF_FAILED(mg_session_write_uint8(session, marker));
  MG_RETURN_IF_FAILED(
      mg_session_write_uint8(session, MG_SIGNATURE_MESSAGE_PULL));

  if (session->version == 4) {
    MG_RETURN_IF_FAILED(mg_session_write_map(session, extra));
  }

  return mg_session_flush_message(session);
}